

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O0

void __thiscall
miniros::ServicePublication::ServicePublication
          (ServicePublication *this,string *name,string *md5sum,string *data_type,
          string *request_data_type,string *response_data_type,ServiceCallbackHelperPtr *helper,
          CallbackQueueInterface *callback_queue,VoidConstPtr *tracked_object)

{
  bool bVar1;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  string *this_00;
  string *this_01;
  string *in_R8;
  string *in_R9;
  undefined8 in_stack_00000010;
  __shared_ptr *in_stack_00000018;
  
  std::enable_shared_from_this<miniros::ServicePublication>::enable_shared_from_this
            ((enable_shared_from_this<miniros::ServicePublication> *)0x4a9503);
  std::__cxx11::string::string((string *)(in_RDI + 0x10),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 0x30),in_RDX);
  this_00 = (string *)(in_RDI + 0x50);
  std::__cxx11::string::string(this_00,in_RCX);
  this_01 = (string *)(in_RDI + 0x70);
  std::__cxx11::string::string(this_01,in_R8);
  std::__cxx11::string::string((string *)(in_RDI + 0x90),in_R9);
  std::shared_ptr<miniros::ServiceCallbackHelper>::shared_ptr
            ((shared_ptr<miniros::ServiceCallbackHelper> *)this_00,
             (shared_ptr<miniros::ServiceCallbackHelper> *)this_01);
  std::
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ::vector((vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
            *)0x4a95a9);
  std::mutex::mutex((mutex *)0x4a95ba);
  *(undefined1 *)(in_RDI + 0x100) = 0;
  *(undefined8 *)(in_RDI + 0x108) = in_stack_00000010;
  *(undefined1 *)(in_RDI + 0x110) = 0;
  std::weak_ptr<void_const>::weak_ptr<void_const,void>
            ((weak_ptr<const_void> *)this_00,(shared_ptr<const_void> *)this_01);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_stack_00000018);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x110) = 1;
  }
  return;
}

Assistant:

ServicePublication::ServicePublication(const std::string& name, const std::string &md5sum, const std::string& data_type, const std::string& request_data_type,
                             const std::string& response_data_type, const ServiceCallbackHelperPtr& helper, CallbackQueueInterface* callback_queue,
                             const VoidConstPtr& tracked_object)
: name_(name)
, md5sum_(md5sum)
, data_type_(data_type)
, request_data_type_(request_data_type)
, response_data_type_(response_data_type)
, helper_(helper)
, dropped_(false)
, callback_queue_(callback_queue)
, has_tracked_object_(false)
, tracked_object_(tracked_object)
{
  if (tracked_object)
  {
    has_tracked_object_ = true;
  }
}